

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TransformFeedback::PositionCase::PositionCase
          (PositionCase *this,Context *context,char *name,char *desc,deUint32 bufferType,
          deUint32 primitiveType)

{
  TransformFeedbackCase::TransformFeedbackCase
            (&this->super_TransformFeedbackCase,context,name,desc,bufferType,primitiveType);
  (this->super_TransformFeedbackCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_01e29470;
  ProgramSpec::addTransformFeedbackVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"gl_Position");
  return;
}

Assistant:

PositionCase (Context& context, const char* name, const char* desc, deUint32 bufferType, deUint32 primitiveType)
		: TransformFeedbackCase(context, name, desc, bufferType, primitiveType)
	{
		m_progSpec.addTransformFeedbackVarying("gl_Position");
	}